

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIEnvironment::drawAll(CGUIEnvironment *this,bool useScreenSize)

{
  u32 uVar1;
  dimension2d<unsigned_int> *other;
  byte in_SIL;
  long *in_RDI;
  rect<int> *in_stack_00000008;
  IGUIElement *in_stack_00000010;
  dimension2d<int> dim;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  CGUIEnvironment *in_stack_ffffffffffffffe0;
  dimension2d<int> local_14;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((local_9 != 0) && (in_RDI[0x33] != 0)) {
    other = (dimension2d<unsigned_int> *)(**(code **)(*(long *)in_RDI[0x33] + 0x1d8))();
    core::dimension2d<int>::dimension2d<unsigned_int>(&local_14,other);
    if (((int)in_RDI[10] != local_14.Width) ||
       ((((int)in_RDI[9] != 0 || (*(int *)((long)in_RDI + 0x54) != local_14.Height)) ||
        (*(int *)((long)in_RDI + 0x4c) != 0)))) {
      core::rect<int>::rect
                ((rect<int> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      IGUIElement::setRelativePosition(in_stack_00000010,in_stack_00000008);
    }
  }
  if (in_RDI[0x28] != 0) {
    (**(code **)(in_RDI[1] + 0xd0))(in_RDI + 1,in_RDI[0x28]);
  }
  (**(code **)(in_RDI[1] + 0x50))(in_RDI + 1);
  uVar1 = os::Timer::getTime();
  (**(code **)(*in_RDI + 0x150))(in_RDI,uVar1);
  clearDeletionQueue(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void CGUIEnvironment::drawAll(bool useScreenSize)
{
	if (useScreenSize && Driver) {
		core::dimension2d<s32> dim(Driver->getScreenSize());
		if (AbsoluteRect.LowerRightCorner.X != dim.Width ||
				AbsoluteRect.UpperLeftCorner.X != 0 ||
				AbsoluteRect.LowerRightCorner.Y != dim.Height ||
				AbsoluteRect.UpperLeftCorner.Y != 0) {
			setRelativePosition(core::recti(0, 0, dim.Width, dim.Height));
		}
	}

	// make sure tooltip is always on top
	if (ToolTip.Element)
		bringToFront(ToolTip.Element);

	draw();
	OnPostRender(os::Timer::getTime());

	clearDeletionQueue();
}